

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm_test.cpp
# Opt level: O3

pint p_test_case_pshm_thread_test(void)

{
  int iVar1;
  time_t tVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  lVar3 = p_shm_new("p_shm_test_memory_block",0x100000,1,0);
  if (lVar3 == 0) {
    uVar9 = 0x101;
  }
  else {
    p_shm_take_ownership(lVar3);
    p_shm_free(lVar3);
    lVar3 = p_shm_new("p_shm_test_memory_block",0x100000,1,0);
    if (lVar3 == 0) {
      uVar9 = 0x106;
    }
    else {
      lVar4 = p_shm_get_size(lVar3);
      if (lVar4 != 0x100000) {
        p_shm_free(lVar3);
        lVar3 = p_shm_new("p_shm_test_memory_block",0x100000,1,0);
        if (lVar3 == 0) {
          uVar9 = 0x10b;
          goto LAB_00101cfd;
        }
      }
      lVar4 = p_shm_get_size(lVar3);
      if (lVar4 == 0x100000) {
        pcVar5 = (char *)p_shm_get_address(lVar3);
        if (pcVar5 == (char *)0x0) {
          uVar9 = 0x111;
        }
        else {
          lVar4 = p_uthread_create(shm_test_thread,lVar3,1,0);
          if (lVar4 == 0) {
            uVar9 = 0x114;
          }
          else {
            lVar6 = p_uthread_create(shm_test_thread,lVar3,1,0);
            if (lVar6 == 0) {
              uVar9 = 0x117;
            }
            else {
              lVar7 = p_uthread_create(shm_test_thread,lVar3,1,0);
              if (lVar7 == 0) {
                uVar9 = 0x11a;
              }
              else {
                iVar1 = p_uthread_join(lVar4);
                if (iVar1 != 0) {
                  printf("%s:%d: check failed\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
                         ,0x11c);
                  p_atomic_int_inc(&p_test_module_fail_counter);
                }
                iVar1 = p_uthread_join(lVar6);
                if (iVar1 != 0) {
                  printf("%s:%d: check failed\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
                         ,0x11d);
                  p_atomic_int_inc(&p_test_module_fail_counter);
                }
                iVar1 = p_uthread_join(lVar7);
                if (iVar1 != 0) {
                  printf("%s:%d: check failed\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
                         ,0x11e);
                  p_atomic_int_inc(&p_test_module_fail_counter);
                }
                lVar8 = 1;
                while (pcVar5[lVar8] == *pcVar5) {
                  lVar8 = lVar8 + 1;
                  if (lVar8 == 0x100000) {
                    p_uthread_unref(lVar4);
                    p_uthread_unref(lVar6);
                    p_uthread_unref(lVar7);
                    p_shm_free(lVar3);
                    p_libsys_shutdown();
                    return -(uint)(p_test_module_fail_counter != 0);
                  }
                }
                uVar9 = 0x129;
              }
            }
          }
        }
      }
      else {
        uVar9 = 0x10e;
      }
    }
  }
LAB_00101cfd:
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp",
         uVar9);
  exit(-1);
}

Assistant:

P_TEST_CASE_BEGIN (pshm_thread_test)
{
	PShm		*shm;
	PUThread	*thr1;
	PUThread	*thr2;
	PUThread	*thr3;
	ppointer	addr;
	pint		val;
	pboolean	test_ok;

	p_libsys_init ();

	srand ((puint) time (NULL));

	shm = p_shm_new ("p_shm_test_memory_block", 1024 * 1024, P_SHM_ACCESS_READWRITE, NULL);
	P_TEST_REQUIRE (shm != NULL);
	p_shm_take_ownership (shm);
	p_shm_free (shm);

	shm = p_shm_new ("p_shm_test_memory_block", 1024 * 1024, P_SHM_ACCESS_READWRITE, NULL);
	P_TEST_REQUIRE (shm != NULL);

	if (p_shm_get_size (shm) != 1024 * 1024) {
		p_shm_free (shm);
		shm = p_shm_new ("p_shm_test_memory_block", 1024 * 1024, P_SHM_ACCESS_READWRITE, NULL);
		P_TEST_REQUIRE (shm != NULL);
	}

	P_TEST_REQUIRE (p_shm_get_size (shm) == 1024 * 1024);

	addr = p_shm_get_address (shm);
	P_TEST_REQUIRE (addr != NULL);

	thr1 = p_uthread_create ((PUThreadFunc) shm_test_thread, (ppointer) shm, TRUE, NULL);
	P_TEST_REQUIRE (thr1 != NULL);

	thr2 = p_uthread_create ((PUThreadFunc) shm_test_thread, (ppointer) shm, TRUE, NULL);
	P_TEST_REQUIRE (thr2 != NULL);

	thr3 = p_uthread_create ((PUThreadFunc) shm_test_thread, (ppointer) shm, TRUE, NULL);
	P_TEST_REQUIRE (thr3 != NULL);

	P_TEST_CHECK (p_uthread_join (thr1) == 0);
	P_TEST_CHECK (p_uthread_join (thr2) == 0);
	P_TEST_CHECK (p_uthread_join (thr3) == 0);

	test_ok = TRUE;
	val = *((pchar *) addr);

	for (int i = 1; i < 1024 * 1024; ++i)
		if (*(((pchar *) addr) + i) != val) {
			test_ok = FALSE;
			break;
		}

	P_TEST_REQUIRE (test_ok == TRUE);

	p_uthread_unref (thr1);
	p_uthread_unref (thr2);
	p_uthread_unref (thr3);
	p_shm_free (shm);

	p_libsys_shutdown ();
}